

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hammersley.cpp
# Opt level: O3

void __thiscall pm::Hammersley::generateSamples(Hammersley *this)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  float fVar7;
  Vector2 pv;
  value_type local_30;
  
  uVar5 = (this->super_Sampler).numSets_;
  if (uVar5 != 0) {
    uVar2 = (this->super_Sampler).numSamples_;
    uVar4 = 0;
    do {
      uVar1 = 0;
      if (uVar2 != 0) {
        uVar6 = 0;
        do {
          local_30.y = 0.0;
          if ((int)uVar6 != 0) {
            fVar7 = 0.5;
            uVar3 = uVar6;
            do {
              uVar5 = (uint)uVar3;
              local_30.y = local_30.y + (float)(uVar5 & 1) * fVar7;
              uVar3 = uVar3 >> 1;
              fVar7 = fVar7 * 0.5;
            } while (1 < uVar5);
          }
          local_30.x = (float)uVar6 / (float)uVar2;
          std::vector<pm::Vector2,_std::allocator<pm::Vector2>_>::push_back
                    (&(this->super_Sampler).samples_,&local_30);
          uVar5 = (int)uVar6 + 1;
          uVar6 = (ulong)uVar5;
          uVar2 = (this->super_Sampler).numSamples_;
        } while (uVar5 < uVar2);
        uVar5 = (this->super_Sampler).numSets_;
        uVar1 = uVar2;
      }
      uVar2 = uVar1;
      uVar4 = uVar4 + 1;
    } while (uVar4 < uVar5);
  }
  return;
}

Assistant:

void Hammersley::generateSamples()
{
	for (unsigned int p = 0; p < numSets_; p++)
	{
		for (unsigned int j = 0; j < numSamples_; j++)
		{
			const Vector2 pv(static_cast<float>(j) / static_cast<float>(numSamples_), phi(j));
			samples_.push_back(pv);
		}
	}
}